

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_use_port(connectdata *conn,ftpport fcmd)

{
  char cVar1;
  unsigned_short uVar2;
  int iVar3;
  CURLcode CVar4;
  uint uVar5;
  if2ip_result_t iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  undefined6 extraout_var;
  byte bVar12;
  long lVar13;
  Curl_addrinfo *ai;
  char cVar14;
  size_t sVar15;
  Curl_easy *pCVar16;
  ftpport fVar17;
  ushort uVar18;
  char *pcVar19;
  curl_socket_t portsock;
  curl_socklen_t sslen;
  Curl_dns_entry *h;
  Curl_sockaddr_storage ss;
  char myhost [256];
  char tmp [1024];
  char hbuf [1025];
  curl_socket_t local_9e4;
  ftpport local_9e0;
  socklen_t local_9dc;
  undefined4 local_9d8;
  uint local_9d4;
  Curl_easy *local_9d0;
  Curl_dns_entry *local_9c8;
  pingpong *local_9c0;
  sockaddr local_9b8 [8];
  char local_938 [256];
  char local_838 [1024];
  char local_438 [1032];
  
  pCVar16 = conn->data;
  local_9e4 = -1;
  memset(local_938,0,0x100);
  pcVar19 = (pCVar16->set).str[0xc];
  local_9c8 = (Curl_dns_entry *)0x0;
  if ((pcVar19 == (char *)0x0) || (sVar7 = strlen(pcVar19), sVar7 < 2)) {
    pcVar8 = (char *)0x0;
    uVar18 = 0;
    local_9d4 = 0;
LAB_00117b60:
    local_9dc = 0x80;
    iVar3 = getsockname(conn->sock[0],local_9b8,&local_9dc);
    if (iVar3 != 0) {
      piVar10 = __errno_location();
      pcVar19 = Curl_strerror(conn,*piVar10);
      pcVar9 = "getsockname() failed: %s";
      goto LAB_00117c9a;
    }
    uVar5 = (uint)local_9b8[0].sa_family;
    if (local_9b8[0].sa_family == 10) {
      pcVar19 = local_9b8[0].sa_data + 6;
      uVar5 = 10;
    }
    else {
      pcVar19 = local_9b8[0].sa_data + 2;
    }
    Curl_inet_ntop(uVar5,pcVar19,local_438,0x401);
    local_9d8 = 0;
    pcVar19 = local_438;
    local_9e0 = fcmd;
  }
  else {
    sVar15 = 0x2f;
    if (0x2d < sVar7) {
      sVar15 = sVar7 + 1;
    }
    pcVar8 = (char *)(*Curl_ccalloc)(sVar15,1);
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar9 = pcVar19;
    local_9e0 = fcmd;
    if (*pcVar19 == ':') {
LAB_00117d6e:
      fcmd = local_9e0;
      pcVar19 = strchr(pcVar9,0x3a);
      if (pcVar19 == (char *)0x0) {
        local_9d4 = 0;
        uVar5 = 0;
      }
      else {
        uVar11 = strtoul(pcVar19 + 1,(char **)0x0,10);
        uVar2 = curlx_ultous(uVar11);
        pcVar19 = strchr(pcVar19,0x2d);
        local_9d4 = (uint)CONCAT62(extraout_var,uVar2);
        uVar5 = local_9d4;
        if (pcVar19 != (char *)0x0) {
          uVar11 = strtoul(pcVar19 + 1,(char **)0x0,10);
          uVar2 = curlx_ultous(uVar11);
          uVar5 = (uint)uVar2;
        }
      }
    }
    else {
      if (*pcVar19 == '[') {
        pcVar9 = strchr(pcVar19,0x5d);
        if (pcVar9 != (char *)0x0) {
          pcVar19 = pcVar19 + 1;
LAB_00117d53:
          strncpy(pcVar8,pcVar19,(long)pcVar9 - (long)pcVar19);
          goto LAB_00117d6e;
        }
      }
      else {
        pcVar9 = strchr(pcVar19,0x3a);
        if ((pcVar9 != (char *)0x0) && (iVar3 = inet_pton(10,pcVar19,local_9b8), iVar3 != 1))
        goto LAB_00117d53;
        strcpy(pcVar8,pcVar19);
      }
      local_9d4 = 0;
      uVar5 = 0;
      fcmd = local_9e0;
    }
    uVar18 = (ushort)uVar5;
    if (uVar18 < (ushort)local_9d4) {
      local_9d4 = 0;
      uVar18 = 0;
    }
    if (*pcVar8 == '\0') goto LAB_00117b60;
    iVar3 = conn->ip_addr->ai_family;
    uVar5 = Curl_ipv6_scope(conn->ip_addr->ai_addr);
    pcVar19 = pcVar8;
    iVar6 = Curl_if2ip(iVar3,uVar5,conn->scope_id,pcVar8,local_438,0x401);
    local_9d8 = (undefined4)CONCAT71((int7)((ulong)pcVar19 >> 8),1);
    pcVar19 = pcVar8;
    if (iVar6 != IF2IP_NOT_FOUND) {
      if (iVar6 == IF2IP_AF_NOT_SUPPORTED) {
        return CURLE_FTP_PORT_FAILED;
      }
      pcVar19 = local_438;
      fcmd = local_9e0;
      if (iVar6 != IF2IP_FOUND) goto LAB_00117b60;
    }
  }
  iVar3 = Curl_resolv(conn,pcVar19,0,&local_9c8);
  if (iVar3 == 1) {
    Curl_resolver_wait_resolv(conn,&local_9c8);
  }
  if (local_9c8 != (Curl_dns_entry *)0x0) {
    ai = local_9c8->addr;
    Curl_resolv_unlock(pCVar16,local_9c8);
    if (ai != (Curl_addrinfo *)0x0) {
      local_9c0 = (pingpong *)&conn->proto;
      (*Curl_cfree)(pcVar8);
      local_9e4 = -1;
      while (CVar4 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)0x0,&local_9e4), CVar4 != CURLE_OK) {
        ai = ai->ai_next;
        if (ai == (Curl_addrinfo *)0x0) {
          piVar10 = __errno_location();
          pcVar19 = Curl_strerror(conn,*piVar10);
          Curl_failf(pCVar16,"socket failure: %s",pcVar19);
          return CURLE_FTP_PORT_FAILED;
        }
      }
      local_9d0 = pCVar16;
      memcpy(local_9b8,ai->ai_addr,(ulong)ai->ai_addrlen);
      local_9dc = ai->ai_addrlen;
      if (uVar18 < (ushort)local_9d4) {
LAB_00117cf6:
        Curl_failf(local_9d0,"bind() failed, we ran out of ports!");
      }
      else {
        uVar5 = local_9d4;
        do {
          while( true ) {
            local_9b8[0].sa_data._0_2_ = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
            iVar3 = bind(local_9e4,local_9b8,local_9dc);
            if (iVar3 == 0) {
              local_9dc = 0x80;
              iVar3 = getsockname(local_9e4,local_9b8,&local_9dc);
              if (iVar3 != 0) {
                piVar10 = __errno_location();
                iVar3 = *piVar10;
                goto LAB_00117f46;
              }
              iVar3 = listen(local_9e4,1);
              pCVar16 = local_9d0;
              if (iVar3 != 0) {
                piVar10 = __errno_location();
                pcVar19 = Curl_strerror(conn,*piVar10);
                pcVar8 = "socket failure: %s";
                goto LAB_00117fb2;
              }
              Curl_printable_address(ai,local_938,0x100);
              bVar12 = (conn->bits).ftp_use_eprt;
              if (((_Bool)bVar12 == false) && ((conn->bits).ipv6 == true)) {
                (conn->bits).ftp_use_eprt = true;
                bVar12 = 1;
              }
              iVar3 = 2;
              if (local_9e0 == DONE) goto LAB_0011806e;
              fVar17 = local_9e0;
              goto LAB_0011802c;
            }
            piVar10 = __errno_location();
            iVar3 = *piVar10;
            if ((iVar3 == 99 & (byte)local_9d8) == 1) break;
            if ((iVar3 != 0xd) && (iVar3 != 0x62)) {
              pcVar19 = Curl_strerror(conn,iVar3);
              Curl_failf(local_9d0,"bind(port=%hu) failed: %s",(ulong)(uVar5 & 0xffff),pcVar19);
              goto LAB_00117fbc;
            }
            uVar5 = uVar5 + 1;
            if (uVar18 < (ushort)uVar5) goto LAB_00117cf6;
          }
          pcVar19 = Curl_strerror(conn,99);
          local_9d8 = 0;
          Curl_infof(local_9d0,"bind(port=%hu) on non-local address failed: %s\n",
                     (ulong)(uVar5 & 0xffff),pcVar19);
          local_9dc = 0x80;
          iVar3 = getsockname(conn->sock[0],local_9b8,&local_9dc);
          uVar5 = local_9d4;
        } while (iVar3 == 0);
        iVar3 = *piVar10;
LAB_00117f46:
        pcVar19 = Curl_strerror(conn,iVar3);
        pcVar8 = "getsockname() failed: %s";
        pCVar16 = local_9d0;
LAB_00117fb2:
        Curl_failf(pCVar16,pcVar8,pcVar19);
      }
LAB_00117fbc:
      Curl_closesocket(conn,local_9e4);
      return CURLE_FTP_PORT_FAILED;
    }
  }
  pcVar9 = "failed to resolve the address provided to PORT: %s";
LAB_00117c9a:
  Curl_failf(pCVar16,pcVar9,pcVar19);
  (*Curl_cfree)(pcVar8);
  return CURLE_FTP_PORT_FAILED;
LAB_0011802c:
  if ((fVar17 == EPRT & (bVar12 ^ 1)) == 0) {
    if (fVar17 == PORT && local_9b8[0].sa_family != 2) goto LAB_0011806e;
    if ((local_9b8[0].sa_family | 8) == 10) {
      if (fVar17 == EPRT) {
        iVar3 = 0;
        CVar4 = Curl_pp_sendf(local_9c0,"%s |%d|%s|%hu|",ftp_state_use_port::mode,
                              (ulong)((local_9b8[0].sa_family != 2) + 1),local_938,
                              (ulong)(ushort)(local_9b8[0].sa_data._0_2_ << 8 |
                                             (ushort)local_9b8[0].sa_data._0_2_ >> 8));
        if (CVar4 != CURLE_OK) {
          pcVar19 = curl_easy_strerror(CVar4);
          Curl_failf(pCVar16,"Failure sending EPRT command: %s",pcVar19);
          Curl_closesocket(conn,local_9e4);
          (conn->proto).ftpc.count1 = 1;
          goto LAB_001181b8;
        }
        goto LAB_0011806e;
      }
      if (fVar17 == PORT) {
        lVar13 = 0;
        while( true ) {
          cVar1 = local_938[lVar13];
          cVar14 = ',';
          if ((cVar1 != '.') && (cVar14 = cVar1, cVar1 == '\0')) break;
          local_838[lVar13] = cVar14;
          lVar13 = lVar13 + 1;
        }
        local_838[lVar13] = '\0';
        curl_msnprintf(local_838 + lVar13,0x14,",%d,%d",(ulong)(local_9b8[0].sa_data._0_2_ & 0xff),
                       (ulong)SUB21(local_9b8[0].sa_data._0_2_,1));
        CVar4 = Curl_pp_sendf(local_9c0,"%s %s",0x14c2c5,local_838);
        if (CVar4 != CURLE_OK) {
          pcVar19 = curl_easy_strerror(CVar4);
          Curl_failf(pCVar16,"Failure sending PORT command: %s",pcVar19);
          Curl_closesocket(conn,local_9e4);
LAB_001181b8:
          (conn->proto).ftpc.state = FTP_STOP;
          return CVar4;
        }
        iVar3 = 1;
LAB_0011806e:
        (conn->proto).ftpc.count1 = iVar3;
        if (conn->sock[1] != -1) {
          Curl_closesocket(conn,conn->sock[1]);
        }
        conn->sock[1] = local_9e4;
        (conn->bits).tcpconnect[1] = true;
        (conn->proto).ftpc.state = FTP_PORT;
        return CURLE_OK;
      }
    }
  }
  fVar17 = fVar17 + PORT;
  if (fVar17 == DONE) goto LAB_0011806e;
  goto LAB_0011802c;
}

Assistant:

static CURLcode ftp_state_use_port(struct connectdata *conn,
                                   ftpport fcmd) /* start with this */

{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct Curl_easy *data = conn->data;
  curl_socket_t portsock = CURL_SOCKET_BAD;
  char myhost[256] = "";

  struct Curl_sockaddr_storage ss;
  Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa = (struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  char tmp[1024];
  static const char mode[][5] = { "EPRT", "PORT" };
  int rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h = NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;

  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen + 1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      ip_end = strchr(string_ftpport, ']');
      if(ip_end)
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
      }
      else {
        ip_end = strchr(string_ftpport, ':');
        if(ip_end) {
          /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
          if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
            /* ipv6 */
            port_min = port_max = 0;
            strcpy(addr, string_ftpport);
            ip_end = NULL; /* this got no port ! */
          }
          else
#endif
            /* (ipv4|domain|interface):port(-range) */
            strncpy(addr, string_ftpport, ip_end - ip_start);
        }
        else
          /* ipv4|interface */
          strcpy(addr, string_ftpport);
      }

    /* parse the port */
    if(ip_end != NULL) {
      port_start = strchr(ip_end, ':');
      if(port_start) {
        port_min = curlx_ultous(strtoul(port_start + 1, NULL, 10));
        port_sep = strchr(port_start, '-');
        if(port_sep) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711,  in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max)
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->ip_addr->ai_family,
                        Curl_ipv6_scope(conn->ip_addr->ai_addr),
                        conn->scope_id, addr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as host name instead */
          host = addr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          return CURLE_FTP_PORT_FAILED;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for host name */
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */

    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
      free(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(conn, host, 0, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(conn, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(res == NULL) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    free(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  free(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(conn, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s", Curl_strerror(conn, error));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */

        infof(data, "bind(port=%hu) on non-local address failed: %s\n", port,
              Curl_strerror(conn, error) );

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(conn, SOCKERRNO) );
          Curl_closesocket(conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(conn, error) );
        Curl_closesocket(conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports!");
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(conn, SOCKERRNO) );
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s", Curl_strerror(conn, SOCKERRNO));
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(&ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
    if(PORT == fcmd) {
      char *source = myhost;
      char *dest = tmp;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest = ',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      snprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(&ftpc->pp, "%s %s", mode[fcmd], tmp);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  close_secondarysocket(conn);

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(conn, FTP_PORT);
  return result;
}